

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

bool __thiscall
cmIfFunctionBlocker::ShouldRemove
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *param_2)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endif");
  if ((iVar2 != 0) ||
     ((bVar3 = true,
      (lff->Arguments).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (lff->Arguments).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
      _M_impl.super__Vector_impl_data._M_finish &&
      (bVar1 = std::operator==(&lff->Arguments,&this->Args), !bVar1)))) {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmIfFunctionBlocker::ShouldRemove(const cmListFileFunction& lff,
                                       cmMakefile&)
{
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endif"))
    {
    // if the endif has arguments, then make sure
    // they match the arguments of the matching if
    if (lff.Arguments.empty() ||
        lff.Arguments == this->Args)
      {
      return true;
      }
    }

  return false;
}